

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_gc.c
# Opt level: O0

int lj_gc_step(lua_State *L)

{
  undefined4 uVar1;
  uint64_t uVar2;
  size_t sVar3;
  ulong uStack_28;
  int32_t ostate;
  GCSize lim;
  global_State *g;
  lua_State *L_local;
  
  uVar2 = (L->glref).ptr64;
  uVar1 = *(undefined4 *)(uVar2 + 0xb8);
  *(undefined4 *)(uVar2 + 0xb8) = 0xfffffffd;
  uStack_28 = (ulong)(uint)(*(int *)(uVar2 + 0x68) * 10);
  if (uStack_28 == 0) {
    uStack_28 = 0x800000000000;
  }
  if (*(ulong *)(uVar2 + 0x18) < *(ulong *)(uVar2 + 0x10)) {
    *(long *)(uVar2 + 0x58) =
         (*(long *)(uVar2 + 0x10) - *(long *)(uVar2 + 0x18)) + *(long *)(uVar2 + 0x58);
  }
  do {
    sVar3 = gc_onestep(L);
    uStack_28 = uStack_28 - sVar3;
    if (*(char *)(uVar2 + 0x21) == '\0') {
      *(ulong *)(uVar2 + 0x18) = (*(ulong *)(uVar2 + 0x60) / 100) * (ulong)*(uint *)(uVar2 + 0x6c);
      *(undefined4 *)(uVar2 + 0xb8) = uVar1;
      return 1;
    }
  } while (0 < (long)uStack_28);
  if (*(ulong *)(uVar2 + 0x58) < 0x400) {
    *(long *)(uVar2 + 0x18) = *(long *)(uVar2 + 0x10) + 0x400;
    *(undefined4 *)(uVar2 + 0xb8) = uVar1;
    L_local._4_4_ = -1;
  }
  else {
    *(long *)(uVar2 + 0x58) = *(long *)(uVar2 + 0x58) + -0x400;
    *(undefined8 *)(uVar2 + 0x18) = *(undefined8 *)(uVar2 + 0x10);
    *(undefined4 *)(uVar2 + 0xb8) = uVar1;
    L_local._4_4_ = 0;
  }
  return L_local._4_4_;
}

Assistant:

int LJ_FASTCALL lj_gc_step(lua_State *L)
{
  global_State *g = G(L);
  GCSize lim;
  int32_t ostate = g->vmstate;
  setvmstate(g, GC);
  lim = (GCSTEPSIZE/100) * g->gc.stepmul;
  if (lim == 0)
    lim = LJ_MAX_MEM;
  if (g->gc.total > g->gc.threshold)
    g->gc.debt += g->gc.total - g->gc.threshold;
  do {
    lim -= (GCSize)gc_onestep(L);
    if (g->gc.state == GCSpause) {
      g->gc.threshold = (g->gc.estimate/100) * g->gc.pause;
      g->vmstate = ostate;
      return 1;  /* Finished a GC cycle. */
    }
  } while (sizeof(lim) == 8 ? ((int64_t)lim > 0) : ((int32_t)lim > 0));
  if (g->gc.debt < GCSTEPSIZE) {
    g->gc.threshold = g->gc.total + GCSTEPSIZE;
    g->vmstate = ostate;
    return -1;
  } else {
    g->gc.debt -= GCSTEPSIZE;
    g->gc.threshold = g->gc.total;
    g->vmstate = ostate;
    return 0;
  }
}